

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battlewithlandlord.cc
# Opt level: O2

BattleWithLandlord * __thiscall
BattleWithLandlord::operator=(BattleWithLandlord *this,BattleWithLandlord *that)

{
  int iVar1;
  
  if (this != that) {
    std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
    operator=(&this->_cards[0]._M_t,&that->_cards[0]._M_t);
    std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
    operator=(&this->_cards[1]._M_t,&that->_cards[1]._M_t);
    CardStyle::operator=(&this->_last,&that->_last);
    iVar1 = that->_round;
    this->_side = that->_side;
    this->_round = iVar1;
    this->_ready = true;
    this->_stopsearch = false;
  }
  return this;
}

Assistant:

BattleWithLandlord& BattleWithLandlord::operator=(const BattleWithLandlord &that) {
    if (this != &that) {
        _cards[0] = that._cards[0];
        _cards[1] = that._cards[1];
        _last = that._last;
        _round = that._round;
        _side = that._side;
        _ready = true;
        _stopsearch = false;
    }
    return *this;
}